

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

input_buffer * __thiscall
dtc::input_buffer::buffer_from_offset
          (input_buffer *__return_storage_ptr__,input_buffer *this,int offset,int s)

{
  int local_20;
  int s_local;
  int offset_local;
  input_buffer *this_local;
  
  if (offset < 0) {
    input_buffer(__return_storage_ptr__);
  }
  else {
    local_20 = s;
    if (s == 0) {
      local_20 = this->size - offset;
    }
    if (this->size < offset) {
      input_buffer(__return_storage_ptr__);
    }
    else if (this->size - offset < local_20) {
      input_buffer(__return_storage_ptr__);
    }
    else {
      input_buffer(__return_storage_ptr__,this->buffer + offset,local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

input_buffer
input_buffer::buffer_from_offset(int offset, int s)
{
	if (offset < 0)
	{
		return input_buffer();
	}
	if (s == 0)
	{
		s = size - offset;
	}
	if (offset > size)
	{
		return input_buffer();
	}
	if (s > (size-offset))
	{
		return input_buffer();
	}
	return input_buffer(&buffer[offset], s);
}